

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O0

void __thiscall
wabt::interp::Istream::EmitAt<unsigned_long>(Istream *this,Offset offset,unsigned_long val)

{
  size_type sVar1;
  uchar *puVar2;
  u32 new_size;
  unsigned_long val_local;
  Offset offset_local;
  Istream *this_local;
  
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data_);
  if (sVar1 < offset + 8) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->data_,(ulong)(offset + 8));
  }
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data_);
  *(unsigned_long *)(puVar2 + offset) = val;
  return;
}

Assistant:

void WABT_VECTORCALL Istream::EmitAt(Offset offset, T val) {
  u32 new_size = offset + sizeof(T);
  if (new_size > data_.size()) {
    data_.resize(new_size);
  }
  memcpy(data_.data() + offset, &val, sizeof(val));
}